

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldTest_SettersOverrideTheDataProperly_Test::
~UnknownFieldTest_SettersOverrideTheDataProperly_Test
          (UnknownFieldTest_SettersOverrideTheDataProperly_Test *this)

{
  UnknownFieldTest_SettersOverrideTheDataProperly_Test *this_local;
  
  ~UnknownFieldTest_SettersOverrideTheDataProperly_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UnknownFieldTest, SettersOverrideTheDataProperly) {
  using T = unittest::TestAllTypes;
  UnknownFieldSet set;
  set.AddVarint(T::kOptionalInt32FieldNumber, 2);
  set.AddFixed32(T::kOptionalFixed32FieldNumber, 3);
  set.AddFixed64(T::kOptionalFixed64FieldNumber, 4);
  set.AddLengthDelimited(T::kOptionalStringFieldNumber, "5");

  T message = UnknownToProto<T>(set);

  EXPECT_EQ(message.optional_int32(), 2);
  EXPECT_EQ(message.optional_fixed32(), 3);
  EXPECT_EQ(message.optional_fixed64(), 4);
  EXPECT_EQ(message.optional_string(), "5");

  set.mutable_field(0)->set_varint(22);
  set.mutable_field(1)->set_fixed32(33);
  set.mutable_field(2)->set_fixed64(44);
  set.mutable_field(3)->set_length_delimited("55");

  message = UnknownToProto<T>(set);

  EXPECT_EQ(message.optional_int32(), 22);
  EXPECT_EQ(message.optional_fixed32(), 33);
  EXPECT_EQ(message.optional_fixed64(), 44);
  EXPECT_EQ(message.optional_string(), "55");

  set.mutable_field(3)->set_length_delimited(std::string("555"));
  message = UnknownToProto<T>(set);
  EXPECT_EQ(message.optional_string(), "555");

  set.mutable_field(3)->set_length_delimited(absl::Cord("5555"));
  message = UnknownToProto<T>(set);
  EXPECT_EQ(message.optional_string(), "5555");
}